

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

void Luv24fromLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int16_t *luv3;
  uint *puVar5;
  
  if (0 < n) {
    puVar5 = (uint *)sp->tbuf;
    lVar4 = n + 1;
    do {
      iVar1 = (int)*(short *)op;
      iVar2 = 0;
      if ((0 < *(short *)op) && (iVar2 = 0x3ff, iVar1 < 0x1cf2)) {
        if (sp->encode_meth == 0) {
          iVar2 = iVar1 + -0xcf2 >> 2;
        }
        else {
          iVar2 = rand();
          iVar2 = (int)((double)iVar2 * 4.656612875245797e-10 + ((double)iVar1 + -3314.0) * 0.25 +
                       -0.5);
        }
      }
      uVar3 = uv_encode(((double)(int)*(short *)((long)op + 2) + 0.5) * 3.0517578125e-05,
                        ((double)(int)*(short *)((long)op + 4) + 0.5) * 3.0517578125e-05,
                        sp->encode_meth);
      if ((int)uVar3 < 0) {
        uVar3 = uv_encode(0.210526316,0.473684211,0);
      }
      *puVar5 = iVar2 << 0xe | uVar3;
      puVar5 = puVar5 + 1;
      op = (uint8_t *)((long)op + 6);
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  return;
}

Assistant:

static void Luv24fromLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    while (n-- > 0)
    {
        int Le, Ce;

        if (luv3[0] <= 0)
            Le = 0;
        else if (luv3[0] >= (1 << 12) + 3314)
            Le = (1 << 10) - 1;
        else if (sp->encode_meth == SGILOGENCODE_NODITHER)
            Le = (luv3[0] - 3314) >> 2;
        else
            Le = tiff_itrunc(.25 * (luv3[0] - 3314.), sp->encode_meth);

        Ce = uv_encode((luv3[1] + .5) / (1 << 15), (luv3[2] + .5) / (1 << 15),
                       sp->encode_meth);
        if (Ce < 0) /* never happens */
            Ce = uv_encode(U_NEU, V_NEU, SGILOGENCODE_NODITHER);
        *luv++ = (uint32_t)Le << 14 | Ce;
        luv3 += 3;
    }
}